

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzstrmatrixflowtbb.cpp
# Opt level: O2

void __thiscall
TPZStructMatrixTBBFlow<std::complex<double>>::Assemble
          (TPZStructMatrixTBBFlow<std::complex<double>> *this)

{
  TPZAutoPointer<TPZGuiInterface> *in_RDX;
  TPZBaseMatrix *in_RSI;
  
  TPZStructMatrixTBBFlow<std::complex<double>_>::Assemble
            ((TPZStructMatrixTBBFlow<std::complex<double>_> *)
             (this + *(long *)(*(long *)this + -0x70)),in_RSI,in_RDX);
  return;
}

Assistant:

void TPZStructMatrixTBBFlow<TVar>::Assemble(TPZBaseMatrix & rhs_base,TPZAutoPointer<TPZGuiInterface> guiInterface){
    const auto &equationFilter =
        (dynamic_cast<TPZStructMatrix*>(this))->EquationFilter();
    if(!dynamic_cast<TPZFMatrix<STATE>*>(&rhs_base)){
        PZError<<__PRETTY_FUNCTION__;
        PZError<<" Incompatible types. Aborting...\n";
        DebugStop();
    }
    auto &rhs = dynamic_cast<TPZFMatrix<STATE> &>(rhs_base);
    ass_rhs.start();
    if(equationFilter.IsActive())
    {
        int64_t neqcondense = equationFilter.NActiveEquations();
        int64_t neqexpand = equationFilter.NEqExpand();
        //TODONORM
        if(rhs.Rows() != neqexpand || Norm(rhs) != 0.)
        {
            DebugStop();
        }
        TPZFMatrix<STATE> rhsloc(neqcondense,1,0.);
        this->MultiThread_Assemble(rhsloc,guiInterface);
        equationFilter.Scatter(rhsloc,rhs);
    }
    else
    {
        this->MultiThread_Assemble(rhs,guiInterface);
    }
    ass_rhs.stop();
}